

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BristolCircuit.cpp
# Opt level: O3

istream * operator>>(istream *s,Circuit *C)

{
  vector<GateType,_std::allocator<GateType>_> *this;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this_00;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this_01;
  bool bVar1;
  uint uVar2;
  int iVar3;
  GateType GVar4;
  istream *piVar5;
  runtime_error *this_02;
  ulong uVar6;
  uint in;
  uint out;
  uint nG;
  string ss;
  uint te;
  uint local_80;
  uint local_7c;
  uint local_6c;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  Circuit *local_48;
  uint local_3c;
  ulong local_38;
  
  piVar5 = std::istream::_M_extract<unsigned_int>((uint *)s);
  std::istream::_M_extract<unsigned_int>((uint *)piVar5);
  this = &C->GateT;
  std::vector<GateType,_std::allocator<GateType>_>::resize(this,(ulong)local_6c);
  this_00 = &C->GateI;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::resize(this_00,(ulong)local_6c);
  this_01 = &C->GateO;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::resize(this_01,(ulong)local_6c);
  std::istream::_M_extract<unsigned_int>((uint *)s);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&C->numI,(ulong)local_3c);
  if ((C->numI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (C->numI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar6 = 1;
    do {
      std::istream::_M_extract<unsigned_int>((uint *)s);
      bVar1 = uVar6 < (ulong)((long)(C->numI).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(C->numI).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2);
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar1);
  }
  std::istream::_M_extract<unsigned_int>((uint *)s);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&C->numO,(ulong)local_3c);
  if ((C->numO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (C->numO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar6 = 1;
    do {
      std::istream::_M_extract<unsigned_int>((uint *)s);
      bVar1 = uVar6 < (ulong)((long)(C->numO).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(C->numO).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2);
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar1);
  }
  local_68 = &local_58;
  local_60 = 0;
  local_58 = 0;
  if (local_6c != 0) {
    uVar6 = 0;
    local_48 = C;
    do {
      piVar5 = std::istream::_M_extract<unsigned_int>((uint *)s);
      std::istream::_M_extract<unsigned_int>((uint *)piVar5);
      uVar2 = local_80;
      if ((int)local_80 < 3) {
        uVar2 = 2;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((this_00->
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar6,(ulong)uVar2);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((this_01->
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar6,(ulong)local_7c);
      local_38 = uVar6;
      if (local_80 != 0) {
        uVar6 = 0;
        do {
          std::istream::_M_extract<unsigned_int>((uint *)s);
          uVar6 = uVar6 + 1;
        } while (uVar6 < local_80);
      }
      if (local_7c != 0) {
        uVar6 = 0;
        do {
          std::istream::_M_extract<unsigned_int>((uint *)s);
          uVar6 = uVar6 + 1;
        } while (uVar6 < local_7c);
      }
      std::operator>>(s,(string *)&local_68);
      uVar6 = local_38;
      iVar3 = std::__cxx11::string::compare((char *)&local_68);
      if (iVar3 == 0) {
        (this->super__Vector_base<GateType,_std::allocator<GateType>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar6] = AND;
LAB_001043ab:
        C = local_48;
        if (local_80 != 2) {
          this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_02,"Circuit error");
          goto LAB_001044d2;
        }
LAB_001043de:
        if (local_7c != 1) {
          this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_02,"Circuit error");
LAB_001044d2:
          __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_68);
        if (iVar3 == 0) {
          (this->super__Vector_base<GateType,_std::allocator<GateType>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar6] = XOR;
          goto LAB_001043ab;
        }
        iVar3 = std::__cxx11::string::compare((char *)&local_68);
        C = local_48;
        if (iVar3 == 0) {
          GVar4 = INV;
LAB_001043c8:
          (this->super__Vector_base<GateType,_std::allocator<GateType>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar6] = GVar4;
LAB_001043d3:
          if (local_80 != 1) {
            this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_02,"Circuit error");
            goto LAB_001044d2;
          }
          goto LAB_001043de;
        }
        iVar3 = std::__cxx11::string::compare((char *)&local_68);
        if (iVar3 == 0) {
          GVar4 = EQ;
          goto LAB_001043c8;
        }
        iVar3 = std::__cxx11::string::compare((char *)&local_68);
        if (iVar3 == 0) {
          (this->super__Vector_base<GateType,_std::allocator<GateType>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar6] = EQW;
          goto LAB_001043d3;
        }
        iVar3 = std::__cxx11::string::compare((char *)&local_68);
        if (iVar3 != 0) {
          this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_02,"Circuit error");
          goto LAB_001044d2;
        }
        (this->super__Vector_base<GateType,_std::allocator<GateType>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar6] = MAND;
        if (local_7c != local_80 >> 1) {
          this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_02,"Circuit error");
          goto LAB_001044d2;
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < local_6c);
  }
  Circuit::recompute_map(C);
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  return s;
}

Assistant:

istream &operator>>(istream &s, Circuit &C) {
  unsigned int nG, te;
  s >> nG >> C.nWires;

  C.GateT.resize(nG);
  C.GateI.resize(nG);
  C.GateO.resize(nG);

  s >> te;
  C.numI.resize(te);
  for (unsigned int i = 0; i < C.numI.size(); i++) {
    s >> C.numI[i];
  }

  s >> te;
  C.numO.resize(te);
  for (unsigned int i = 0; i < C.numO.size(); i++) {
    s >> C.numO[i];
  }

  unsigned int in, out;
  string ss;
  for (unsigned int i = 0; i < nG; i++) {
    s >> in >> out;
    C.GateI[i].resize(max(2, (int)in));
    C.GateO[i].resize(out);
    for (unsigned int j = 0; j < in; j++) {
      s >> C.GateI[i][j];
    }
    for (unsigned int j = 0; j < out; j++) {
      s >> C.GateO[i][j];
    }
    s >> ss;
    if (ss.compare("AND") == 0) {
      C.GateT[i] = AND;
    } else if (ss.compare("XOR") == 0) {
      C.GateT[i] = XOR;
    } else if (ss.compare("INV") == 0) {
      C.GateT[i] = INV;
    } else if (ss.compare("EQ") == 0) {
      C.GateT[i] = EQ;
    } else if (ss.compare("EQW") == 0) {
      C.GateT[i] = EQW;
    } else if (ss.compare("MAND") == 0) {
      C.GateT[i] = MAND;
    } else {
      throw std::runtime_error("Circuit error");
    }

    // Check dimensions of in and out are all OK
    if ((C.GateT[i] == INV || C.GateT[i] == EQ || C.GateT[i] == EQW) &&
        in != 1) {
      throw std::runtime_error("Circuit error");
    }
    if ((C.GateT[i] == AND || C.GateT[i] == XOR) && in != 2) {
      throw std::runtime_error("Circuit error");
    }
    if ((C.GateT[i] != MAND) && out != 1) {
      throw std::runtime_error("Circuit error");
    }
    if ((C.GateT[i] == MAND) && out != in / 2) {
      throw std::runtime_error("Circuit error");
    }
  }

  C.recompute_map();

  return s;
}